

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

bool __thiscall
Clasp::DefaultUnfoundedCheck::assertAtom(DefaultUnfoundedCheck *this,Literal a,UfsType t)

{
  size_type sVar1;
  ReasonStrategy RVar2;
  LitVec *pLVar3;
  bool bVar4;
  pointer puVar5;
  uint uVar6;
  Solver *s;
  byte bVar7;
  Result RVar8;
  Antecedent local_38;
  Literal local_2c;
  
  s = this->solver_;
  puVar5 = (s->assign_).assign_.ebo_.buf;
  bVar7 = 2 - ((a.rep_ & 2) == 0);
  if ((((*(byte *)((long)puVar5 + (ulong)(a.rep_ & 0xfffffffc)) & 3) == bVar7) ||
      (this->strategy_ == distinct_reason)) || ((this->activeClause_).ebo_.size == 0)) {
    if ((this->loopAtoms_).ebo_.size != 0) {
      createLoopFormula(this);
    }
    uVar6 = a.rep_ & 0xfffffffe ^ 2;
    local_38.data_ = (uint64)&local_2c;
    (this->activeClause_).ebo_.size = 0;
    local_2c.rep_ = uVar6;
    bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
    insert_impl<unsigned_int,bk_lib::detail::Fill<Clasp::Literal>>
              ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)&this->activeClause_,
               (this->activeClause_).ebo_.buf,1,(Fill<Clasp::Literal> *)&local_38);
    computeReason(this,t);
    s = this->solver_;
    puVar5 = (s->assign_).assign_.ebo_.buf;
  }
  else {
    uVar6 = a.rep_ & 0xfffffffe ^ 2;
  }
  ((this->activeClause_).ebo_.buf)->rep_ = uVar6;
  if ((((((byte)puVar5[a.rep_ >> 2] & 3) == bVar7) ||
       (RVar2 = this->strategy_, RVar2 == only_reason)) || (RVar2 == no_reason)) ||
     (((RVar2 == shared_reason && (3 < (this->activeClause_).ebo_.size)) &&
      ((this->info_).super_ConstraintScore.rep < 0x40000000)))) {
    local_38.data_ = (uint64)this;
    local_2c.rep_ = uVar6;
    bVar4 = Solver::force(s,&local_2c,&local_38);
    if (bVar4) {
      bVar4 = true;
      if (this->strategy_ != no_reason) {
        if (this->strategy_ == only_reason) {
          pLVar3 = this->reasons_;
          uVar6 = (a.rep_ >> 2) - 1;
          local_38.data_ = (uint64)((this->activeClause_).ebo_.buf + 1);
          sVar1 = (this->activeClause_).ebo_.size;
          pLVar3[uVar6].ebo_.size = 0;
          bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
          insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
                    ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)(pLVar3 + uVar6),
                     pLVar3[uVar6].ebo_.buf,sVar1 - 1,(Memcpy<Clasp::Literal> *)&local_38);
        }
        else {
          local_38.data_._0_4_ = uVar6;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (&this->loopAtoms_,(Literal *)&local_38);
        }
      }
    }
    else {
      bVar4 = false;
    }
  }
  else {
    RVar8 = ClauseCreator::create(s,&this->activeClause_,0x80,&this->info_);
    bVar4 = ((undefined1  [16])RVar8 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
  }
  return bVar4;
}

Assistant:

bool DefaultUnfoundedCheck::assertAtom(Literal a, UfsType t) {
	if (solver_->isTrue(a) || strategy_ == distinct_reason || activeClause_.empty()) {
		// Conflict, first atom of unfounded set, or distinct reason for each atom requested -
		// compute reason for a being unfounded.
		// We must flush any not yet created loop formula here - the
		// atoms in loopAtoms_ depend on the current reason which is about to be replaced.
		if (!loopAtoms_.empty()) {
			createLoopFormula();
		}
		activeClause_.assign(1, ~a);
		computeReason(t);
	}
	activeClause_[0] = ~a;
	bool tainted = info_.tagged() || info_.aux();
	bool noClause = solver_->isTrue(a) || strategy_ == no_reason || strategy_ == only_reason || (strategy_ == shared_reason && activeClause_.size() > 3 && !tainted);
	if (noClause) {
		if (!solver_->force(~a, this))  { return false; }
		if (strategy_ == only_reason)   { reasons_[a.var()-1].assign(activeClause_.begin()+1, activeClause_.end()); }
		else if (strategy_ != no_reason){ loopAtoms_.push_back(~a); }
		return true;
	}
	else { // learn nogood and assert ~a
		return ClauseCreator::create(*solver_, activeClause_, ClauseCreator::clause_no_prepare, info_).ok();
	}
}